

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  size_t k;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  vbool<4> vVar22;
  uint uVar23;
  int iVar24;
  undefined4 uVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar30;
  ulong uVar31;
  NodeRef *pNVar32;
  bool bVar33;
  float fVar34;
  vint4 ai_2;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 in_ZMM0 [64];
  float fVar45;
  float fVar52;
  float fVar53;
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 bi_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi_3;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 bi_2;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar75;
  float fVar76;
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  vint4 ai_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  vint4 ai_3;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  uint uVar96;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  undefined1 in_ZMM11 [64];
  undefined1 auVar97 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar101;
  undefined1 auVar102 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  Precalculations pre;
  vbool<4> terminated;
  undefined1 local_1968 [16];
  undefined1 local_1958 [16];
  undefined1 local_1948 [16];
  RTCFilterFunctionNArguments args;
  TravRayK<4,_false> tray;
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [8];
  float fStack_17d0;
  float fStack_17cc;
  undefined1 local_17c8 [8];
  float fStack_17c0;
  float fStack_17bc;
  undefined1 local_17b8 [8];
  float fStack_17b0;
  float fStack_17ac;
  undefined8 local_1768;
  undefined8 uStack_1760;
  undefined8 local_1758;
  undefined8 uStack_1750;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  uint local_16f8;
  uint uStack_16f4;
  uint uStack_16f0;
  uint uStack_16ec;
  undefined1 auStack_16e8 [16];
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar6 = mm_lookupmask_ps._0_16_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar60 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar62 = vpcmpeqd_avx(auVar60,(undefined1  [16])valid_i->field_0);
    auVar41 = ZEXT816(0) << 0x40;
    auVar51 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41,5);
    auVar50 = auVar62 & auVar51;
    if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar50[0xf] < '\0')
    {
      auVar51 = vandps_avx(auVar51,auVar62);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar90._8_4_ = 0x7fffffff;
      auVar90._0_8_ = 0x7fffffff7fffffff;
      auVar90._12_4_ = 0x7fffffff;
      auVar62 = vandps_avx(auVar90,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar82._8_4_ = 0x219392ef;
      auVar82._0_8_ = 0x219392ef219392ef;
      auVar82._12_4_ = 0x219392ef;
      auVar62 = vcmpps_avx(auVar62,auVar82,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar82,auVar62);
      auVar62 = vandps_avx(auVar90,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar62 = vcmpps_avx(auVar62,auVar82,1);
      auVar71 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar82,auVar62);
      auVar62 = vandps_avx(auVar90,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar62 = vcmpps_avx(auVar62,auVar82,1);
      auVar62 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar82,auVar62);
      auVar66 = vrcpps_avx(auVar50);
      fVar45 = auVar66._0_4_;
      auVar61._0_4_ = auVar50._0_4_ * fVar45;
      fVar52 = auVar66._4_4_;
      auVar61._4_4_ = auVar50._4_4_ * fVar52;
      fVar53 = auVar66._8_4_;
      auVar61._8_4_ = auVar50._8_4_ * fVar53;
      fVar54 = auVar66._12_4_;
      auVar61._12_4_ = auVar50._12_4_ * fVar54;
      auVar83._8_4_ = 0x3f800000;
      auVar83._0_8_ = &DAT_3f8000003f800000;
      auVar83._12_4_ = 0x3f800000;
      auVar50 = vsubps_avx(auVar83,auVar61);
      tray.rdir.field_0._0_4_ = fVar45 + fVar45 * auVar50._0_4_;
      tray.rdir.field_0._4_4_ = fVar52 + fVar52 * auVar50._4_4_;
      tray.rdir.field_0._8_4_ = fVar53 + fVar53 * auVar50._8_4_;
      tray.rdir.field_0._12_4_ = fVar54 + fVar54 * auVar50._12_4_;
      auVar50 = vrcpps_avx(auVar71);
      fVar45 = auVar50._0_4_;
      auVar66._0_4_ = auVar71._0_4_ * fVar45;
      fVar52 = auVar50._4_4_;
      auVar66._4_4_ = auVar71._4_4_ * fVar52;
      fVar53 = auVar50._8_4_;
      auVar66._8_4_ = auVar71._8_4_ * fVar53;
      fVar54 = auVar50._12_4_;
      auVar66._12_4_ = auVar71._12_4_ * fVar54;
      auVar50 = vsubps_avx(auVar83,auVar66);
      tray.rdir.field_0._16_4_ = fVar45 + fVar45 * auVar50._0_4_;
      tray.rdir.field_0._20_4_ = fVar52 + fVar52 * auVar50._4_4_;
      tray.rdir.field_0._24_4_ = fVar53 + fVar53 * auVar50._8_4_;
      tray.rdir.field_0._28_4_ = fVar54 + fVar54 * auVar50._12_4_;
      auVar50 = vrcpps_avx(auVar62);
      fVar45 = auVar50._0_4_;
      auVar71._0_4_ = auVar62._0_4_ * fVar45;
      fVar52 = auVar50._4_4_;
      auVar71._4_4_ = auVar62._4_4_ * fVar52;
      fVar53 = auVar50._8_4_;
      auVar71._8_4_ = auVar62._8_4_ * fVar53;
      fVar54 = auVar50._12_4_;
      auVar71._12_4_ = auVar62._12_4_ * fVar54;
      auVar62 = vsubps_avx(auVar83,auVar71);
      tray.rdir.field_0._32_4_ = fVar45 + fVar45 * auVar62._0_4_;
      tray.rdir.field_0._36_4_ = fVar52 + fVar52 * auVar62._4_4_;
      tray.rdir.field_0._40_4_ = fVar53 + fVar53 * auVar62._8_4_;
      tray.rdir.field_0._44_4_ = fVar54 + fVar54 * auVar62._12_4_;
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar41,1);
      auVar78._8_4_ = 0x10;
      auVar78._0_8_ = 0x1000000010;
      auVar78._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar62,auVar78);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar41,5);
      auVar50._8_4_ = 0x20;
      auVar50._0_8_ = 0x2000000020;
      auVar50._12_4_ = 0x20;
      auVar79._8_4_ = 0x30;
      auVar79._0_8_ = 0x3000000030;
      auVar79._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar79,auVar50,auVar62);
      auVar62 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar41,5);
      auVar72._8_4_ = 0x40;
      auVar72._0_8_ = 0x4000000040;
      auVar72._12_4_ = 0x40;
      auVar80._8_4_ = 0x50;
      auVar80._0_8_ = 0x5000000050;
      auVar80._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar80,auVar72,auVar62);
      auVar62 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar41);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar95 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar62,auVar51);
      auVar62._8_4_ = 0xff800000;
      auVar62._0_8_ = 0xff800000ff800000;
      auVar62._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar62,auVar50,auVar51);
      terminated.field_0.i[1] = auVar51._4_4_ ^ auVar60._4_4_;
      terminated.field_0.i[0] = auVar51._0_4_ ^ auVar60._0_4_;
      terminated.field_0.i[2] = auVar51._8_4_ ^ auVar60._8_4_;
      terminated.field_0.i[3] = auVar51._12_4_ ^ auVar60._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 3;
      }
      else {
        uVar29 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar32 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar30 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar60 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar97 = ZEXT1664(auVar60);
LAB_003180f7:
      paVar30 = paVar30 + -1;
      root.ptr = pNVar32[-1].ptr;
      pNVar32 = pNVar32 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_003189cb;
      aVar101 = *paVar30;
      auVar60 = vcmpps_avx((undefined1  [16])aVar101,(undefined1  [16])tray.tfar.field_0,1);
      uVar23 = vmovmskps_avx(auVar60);
      if (uVar23 == 0) {
LAB_003189dc:
        iVar24 = 2;
      }
      else {
        uVar31 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        iVar24 = 0;
        if (uVar23 <= uVar29) {
          do {
            k = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar97 = ZEXT1664(auVar97._0_16_);
            bVar33 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar33) {
              terminated.field_0.i[k] = -1;
            }
            uVar31 = uVar31 & uVar31 - 1;
          } while (uVar31 != 0);
          auVar60 = vpcmpeqd_avx(auVar97._0_16_,auVar97._0_16_);
          auVar97 = ZEXT1664(auVar60);
          auVar60 = auVar60 & ~(undefined1  [16])terminated.field_0;
          iVar24 = 3;
          auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar60[0xf] < '\0') {
            auVar60._8_4_ = 0xff800000;
            auVar60._0_8_ = 0xff800000ff800000;
            auVar60._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar60,
                               (undefined1  [16])terminated.field_0);
            iVar24 = 2;
          }
        }
        vVar22.field_0 = terminated.field_0;
        if (uVar29 < uVar23) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003189cb;
              auVar60 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar101,6);
              if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar60[0xf]) goto LAB_003189dc;
              uVar31 = (ulong)((uint)root.ptr & 0xf);
              if (uVar31 == 8) goto LAB_00318995;
              lVar28 = (root.ptr & 0xfffffffffffffff0) + 0xa0;
              uVar26 = 0;
              auVar60 = auVar97._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_00318337;
            }
            auVar102 = ZEXT1664(auVar95._0_16_);
            uVar31 = 0;
            uVar26 = 8;
            do {
              uVar27 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar31 * 8);
              if (uVar27 != 8) {
                uVar25 = *(undefined4 *)(root.ptr + 0x20 + uVar31 * 4);
                auVar35._4_4_ = uVar25;
                auVar35._0_4_ = uVar25;
                auVar35._8_4_ = uVar25;
                auVar35._12_4_ = uVar25;
                auVar19._8_8_ = tray.org.field_0._8_8_;
                auVar19._0_8_ = tray.org.field_0._0_8_;
                auVar20._8_8_ = tray.org.field_0._24_8_;
                auVar20._0_8_ = tray.org.field_0._16_8_;
                auVar21._8_8_ = tray.org.field_0._40_8_;
                auVar21._0_8_ = tray.org.field_0._32_8_;
                auVar60 = vsubps_avx(auVar35,auVar19);
                auVar73._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar60._0_4_;
                auVar73._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar60._4_4_;
                auVar73._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar60._8_4_;
                auVar73._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar60._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x40 + uVar31 * 4);
                auVar36._4_4_ = uVar25;
                auVar36._0_4_ = uVar25;
                auVar36._8_4_ = uVar25;
                auVar36._12_4_ = uVar25;
                auVar60 = vsubps_avx(auVar36,auVar20);
                auVar84._0_4_ = tray.rdir.field_0._16_4_ * auVar60._0_4_;
                auVar84._4_4_ = tray.rdir.field_0._20_4_ * auVar60._4_4_;
                auVar84._8_4_ = tray.rdir.field_0._24_4_ * auVar60._8_4_;
                auVar84._12_4_ = tray.rdir.field_0._28_4_ * auVar60._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x60 + uVar31 * 4);
                auVar37._4_4_ = uVar25;
                auVar37._0_4_ = uVar25;
                auVar37._8_4_ = uVar25;
                auVar37._12_4_ = uVar25;
                auVar60 = vsubps_avx(auVar37,auVar21);
                auVar91._0_4_ = tray.rdir.field_0._32_4_ * auVar60._0_4_;
                auVar91._4_4_ = tray.rdir.field_0._36_4_ * auVar60._4_4_;
                auVar91._8_4_ = tray.rdir.field_0._40_4_ * auVar60._8_4_;
                auVar91._12_4_ = tray.rdir.field_0._44_4_ * auVar60._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x30 + uVar31 * 4);
                auVar38._4_4_ = uVar25;
                auVar38._0_4_ = uVar25;
                auVar38._8_4_ = uVar25;
                auVar38._12_4_ = uVar25;
                auVar60 = vsubps_avx(auVar38,auVar19);
                auVar46._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar60._0_4_;
                auVar46._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar60._4_4_;
                auVar46._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar60._8_4_;
                auVar46._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar60._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x50 + uVar31 * 4);
                auVar39._4_4_ = uVar25;
                auVar39._0_4_ = uVar25;
                auVar39._8_4_ = uVar25;
                auVar39._12_4_ = uVar25;
                auVar60 = vsubps_avx(auVar39,auVar20);
                auVar55._0_4_ = tray.rdir.field_0._16_4_ * auVar60._0_4_;
                auVar55._4_4_ = tray.rdir.field_0._20_4_ * auVar60._4_4_;
                auVar55._8_4_ = tray.rdir.field_0._24_4_ * auVar60._8_4_;
                auVar55._12_4_ = tray.rdir.field_0._28_4_ * auVar60._12_4_;
                uVar25 = *(undefined4 *)(root.ptr + 0x70 + uVar31 * 4);
                auVar40._4_4_ = uVar25;
                auVar40._0_4_ = uVar25;
                auVar40._8_4_ = uVar25;
                auVar40._12_4_ = uVar25;
                auVar60 = vsubps_avx(auVar40,auVar21);
                auVar63._0_4_ = tray.rdir.field_0._32_4_ * auVar60._0_4_;
                auVar63._4_4_ = tray.rdir.field_0._36_4_ * auVar60._4_4_;
                auVar63._8_4_ = tray.rdir.field_0._40_4_ * auVar60._8_4_;
                auVar63._12_4_ = tray.rdir.field_0._44_4_ * auVar60._12_4_;
                auVar60 = vpminsd_avx(auVar73,auVar46);
                auVar62 = vpminsd_avx(auVar84,auVar55);
                auVar60 = vpmaxsd_avx(auVar60,auVar62);
                auVar62 = vpminsd_avx(auVar91,auVar63);
                auVar62 = vpmaxsd_avx(auVar60,auVar62);
                auVar60 = vpmaxsd_avx(auVar73,auVar46);
                auVar50 = vpmaxsd_avx(auVar84,auVar55);
                auVar50 = vpminsd_avx(auVar60,auVar50);
                auVar60 = vpmaxsd_avx(auVar91,auVar63);
                auVar50 = vpminsd_avx(auVar50,auVar60);
                auVar60 = vpmaxsd_avx(auVar62,(undefined1  [16])tray.tnear.field_0);
                auVar50 = vpminsd_avx(auVar50,(undefined1  [16])tray.tfar.field_0);
                auVar60 = vcmpps_avx(auVar60,auVar50,2);
                if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar60 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar60 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar60[0xf] < '\0') {
                  auVar60 = vblendvps_avx(auVar95._0_16_,auVar62,auVar60);
                  if (uVar26 != 8) {
                    pNVar32->ptr = uVar26;
                    pNVar32 = pNVar32 + 1;
                    *paVar30 = auVar102._0_16_;
                    paVar30 = paVar30 + 1;
                  }
                  auVar102 = ZEXT1664(auVar60);
                  uVar26 = uVar27;
                }
              }
              aVar101 = auVar102._0_16_;
            } while ((uVar27 != 8) && (bVar33 = uVar31 < 3, uVar31 = uVar31 + 1, bVar33));
            iVar24 = 0;
            if (uVar26 == 8) {
LAB_003182dd:
              bVar33 = false;
              iVar24 = 4;
            }
            else {
              auVar60 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar101,6);
              uVar25 = vmovmskps_avx(auVar60);
              bVar33 = true;
              if ((uint)POPCOUNT(uVar25) <= uVar29) {
                pNVar32->ptr = uVar26;
                pNVar32 = pNVar32 + 1;
                *paVar30 = aVar101;
                paVar30 = paVar30 + 1;
                goto LAB_003182dd;
              }
            }
            root.ptr = uVar26;
          } while (bVar33);
        }
      }
      goto LAB_003189ce;
    }
  }
  return;
  while( true ) {
    uVar26 = uVar26 + 1;
    lVar28 = lVar28 + 0xb0;
    auVar60 = auVar50;
    if (uVar31 - 8 <= uVar26) break;
LAB_00318337:
    uVar27 = 0;
    auVar62 = auVar60;
    while( true ) {
      uVar23 = *(uint *)(lVar28 + -0x10 + uVar27 * 4);
      if ((ulong)uVar23 == 0xffffffff) break;
      uVar25 = *(undefined4 *)(lVar28 + -0xa0 + uVar27 * 4);
      auVar41._4_4_ = uVar25;
      auVar41._0_4_ = uVar25;
      auVar41._8_4_ = uVar25;
      auVar41._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar28 + -0x90 + uVar27 * 4);
      auVar56._4_4_ = uVar25;
      auVar56._0_4_ = uVar25;
      auVar56._8_4_ = uVar25;
      auVar56._12_4_ = uVar25;
      uVar25 = *(undefined4 *)(lVar28 + -0x80 + uVar27 * 4);
      auVar64._4_4_ = uVar25;
      auVar64._0_4_ = uVar25;
      auVar64._8_4_ = uVar25;
      auVar64._12_4_ = uVar25;
      fVar45 = *(float *)(lVar28 + -0x70 + uVar27 * 4);
      fVar52 = *(float *)(lVar28 + -0x60 + uVar27 * 4);
      fVar53 = *(float *)(lVar28 + -0x50 + uVar27 * 4);
      fVar54 = *(float *)(lVar28 + -0x40 + uVar27 * 4);
      fVar2 = *(float *)(lVar28 + -0x30 + uVar27 * 4);
      fVar3 = *(float *)(lVar28 + -0x20 + uVar27 * 4);
      auVar50 = vsubps_avx(auVar41,*(undefined1 (*) [16])ray);
      auVar41 = vsubps_avx(auVar56,*(undefined1 (*) [16])(ray + 0x10));
      auVar71 = vsubps_avx(auVar64,*(undefined1 (*) [16])(ray + 0x20));
      fVar7 = *(float *)(ray + 0x50);
      fVar8 = *(float *)(ray + 0x54);
      fVar9 = *(float *)(ray + 0x58);
      fVar10 = *(float *)(ray + 0x5c);
      fVar11 = *(float *)(ray + 0x60);
      fVar12 = *(float *)(ray + 100);
      fVar13 = *(float *)(ray + 0x68);
      fVar14 = *(float *)(ray + 0x6c);
      fVar85 = auVar71._0_4_;
      auVar92._0_4_ = fVar85 * fVar7;
      fVar87 = auVar71._4_4_;
      auVar92._4_4_ = fVar87 * fVar8;
      fVar88 = auVar71._8_4_;
      auVar92._8_4_ = fVar88 * fVar9;
      fVar89 = auVar71._12_4_;
      auVar92._12_4_ = fVar89 * fVar10;
      fVar70 = auVar41._0_4_;
      auVar103._0_4_ = fVar70 * fVar11;
      fVar75 = auVar41._4_4_;
      auVar103._4_4_ = fVar75 * fVar12;
      fVar76 = auVar41._8_4_;
      auVar103._8_4_ = fVar76 * fVar13;
      fVar77 = auVar41._12_4_;
      auVar103._12_4_ = fVar77 * fVar14;
      auVar72 = vsubps_avx(auVar103,auVar92);
      fVar15 = *(float *)(ray + 0x40);
      fVar16 = *(float *)(ray + 0x44);
      fVar17 = *(float *)(ray + 0x48);
      fVar18 = *(float *)(ray + 0x4c);
      fVar34 = auVar50._0_4_;
      auVar104._0_4_ = fVar34 * fVar11;
      fVar42 = auVar50._4_4_;
      auVar104._4_4_ = fVar42 * fVar12;
      fVar43 = auVar50._8_4_;
      auVar104._8_4_ = fVar43 * fVar13;
      fVar44 = auVar50._12_4_;
      auVar104._12_4_ = fVar44 * fVar14;
      auVar105._0_4_ = fVar85 * fVar15;
      auVar105._4_4_ = fVar87 * fVar16;
      auVar105._8_4_ = fVar88 * fVar17;
      auVar105._12_4_ = fVar89 * fVar18;
      auVar78 = vsubps_avx(auVar105,auVar104);
      auVar106._0_4_ = fVar15 * fVar70;
      auVar106._4_4_ = fVar16 * fVar75;
      auVar106._8_4_ = fVar17 * fVar76;
      auVar106._12_4_ = fVar18 * fVar77;
      auVar67._0_4_ = fVar34 * fVar7;
      auVar67._4_4_ = fVar42 * fVar8;
      auVar67._8_4_ = fVar43 * fVar9;
      auVar67._12_4_ = fVar44 * fVar10;
      auVar79 = vsubps_avx(auVar67,auVar106);
      auVar50 = ZEXT416((uint)(fVar3 * fVar45 - fVar54 * fVar53));
      auVar66 = vshufps_avx(auVar50,auVar50,0);
      auVar50 = ZEXT416((uint)(fVar54 * fVar52 - fVar2 * fVar45));
      auVar61 = vshufps_avx(auVar50,auVar50,0);
      auVar80 = vpermilps_avx(ZEXT416((uint)(fVar2 * fVar53 - fVar3 * fVar52)),0);
      auVar47._0_4_ = fVar15 * auVar80._0_4_ + auVar66._0_4_ * fVar7 + auVar61._0_4_ * fVar11;
      auVar47._4_4_ = fVar16 * auVar80._4_4_ + auVar66._4_4_ * fVar8 + auVar61._4_4_ * fVar12;
      auVar47._8_4_ = fVar17 * auVar80._8_4_ + auVar66._8_4_ * fVar9 + auVar61._8_4_ * fVar13;
      auVar47._12_4_ = fVar18 * auVar80._12_4_ + auVar66._12_4_ * fVar10 + auVar61._12_4_ * fVar14;
      auVar93._8_4_ = 0x80000000;
      auVar93._0_8_ = 0x8000000080000000;
      auVar93._12_4_ = 0x80000000;
      auVar50 = vandps_avx(auVar93,auVar47);
      uVar96 = auVar50._0_4_;
      auVar94._0_4_ =
           uVar96 ^ (uint)(fVar54 * auVar72._0_4_ + fVar2 * auVar78._0_4_ + fVar3 * auVar79._0_4_);
      uVar98 = auVar50._4_4_;
      auVar94._4_4_ =
           uVar98 ^ (uint)(fVar54 * auVar72._4_4_ + fVar2 * auVar78._4_4_ + fVar3 * auVar79._4_4_);
      uVar99 = auVar50._8_4_;
      auVar94._8_4_ =
           uVar99 ^ (uint)(fVar54 * auVar72._8_4_ + fVar2 * auVar78._8_4_ + fVar3 * auVar79._8_4_);
      uVar100 = auVar50._12_4_;
      auVar94._12_4_ =
           uVar100 ^ (uint)(fVar54 * auVar72._12_4_ +
                           fVar2 * auVar78._12_4_ + fVar3 * auVar79._12_4_);
      auVar71 = vcmpps_avx(auVar94,_DAT_01feba10,5);
      auVar82 = auVar62 & auVar71;
      auVar41 = auVar6;
      if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar82[0xf])
      {
LAB_0031849d:
        auVar50 = vpcmpeqd_avx(auVar50,auVar50);
      }
      else {
        auVar71 = vandps_avx(auVar71,auVar62);
        auVar74._0_4_ =
             uVar96 ^ (uint)(auVar72._0_4_ * fVar45 +
                            auVar78._0_4_ * fVar52 + auVar79._0_4_ * fVar53);
        auVar74._4_4_ =
             uVar98 ^ (uint)(auVar72._4_4_ * fVar45 +
                            auVar78._4_4_ * fVar52 + auVar79._4_4_ * fVar53);
        auVar74._8_4_ =
             uVar99 ^ (uint)(auVar72._8_4_ * fVar45 +
                            auVar78._8_4_ * fVar52 + auVar79._8_4_ * fVar53);
        auVar74._12_4_ =
             uVar100 ^ (uint)(auVar72._12_4_ * fVar45 +
                             auVar78._12_4_ * fVar52 + auVar79._12_4_ * fVar53);
        auVar72 = vcmpps_avx(auVar74,_DAT_01feba10,5);
        auVar78 = auVar71 & auVar72;
        local_1958 = auVar80;
        local_1948 = auVar47;
        if ((((auVar78 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar78 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar78 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar78[0xf]
           ) goto LAB_0031849d;
        auVar68._8_4_ = 0x7fffffff;
        auVar68._0_8_ = 0x7fffffff7fffffff;
        auVar68._12_4_ = 0x7fffffff;
        auVar78 = vandps_avx(auVar68,auVar47);
        auVar71 = vandps_avx(auVar71,auVar72);
        auVar72 = vsubps_avx(auVar78,auVar94);
        auVar72 = vcmpps_avx(auVar72,auVar74,5);
        auVar79 = auVar71 & auVar72;
        if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar79[0xf] < '\0') {
          auVar71 = vandps_avx(auVar72,auVar71);
          auVar69._0_4_ =
               uVar96 ^ (uint)(auVar80._0_4_ * fVar34 +
                              fVar70 * auVar66._0_4_ + auVar61._0_4_ * fVar85);
          auVar69._4_4_ =
               uVar98 ^ (uint)(auVar80._4_4_ * fVar42 +
                              fVar75 * auVar66._4_4_ + auVar61._4_4_ * fVar87);
          auVar69._8_4_ =
               uVar99 ^ (uint)(auVar80._8_4_ * fVar43 +
                              fVar76 * auVar66._8_4_ + auVar61._8_4_ * fVar88);
          auVar69._12_4_ =
               uVar100 ^ (uint)(auVar80._12_4_ * fVar44 +
                               fVar77 * auVar66._12_4_ + auVar61._12_4_ * fVar89);
          auVar81._0_4_ = auVar78._0_4_ * *(float *)(ray + 0x30);
          auVar81._4_4_ = auVar78._4_4_ * *(float *)(ray + 0x34);
          auVar81._8_4_ = auVar78._8_4_ * *(float *)(ray + 0x38);
          auVar81._12_4_ = auVar78._12_4_ * *(float *)(ray + 0x3c);
          auVar86._0_4_ = auVar78._0_4_ * *(float *)(ray + 0x80);
          auVar86._4_4_ = auVar78._4_4_ * *(float *)(ray + 0x84);
          auVar86._8_4_ = auVar78._8_4_ * *(float *)(ray + 0x88);
          auVar86._12_4_ = auVar78._12_4_ * *(float *)(ray + 0x8c);
          auVar72 = vcmpps_avx(auVar81,auVar69,1);
          auVar79 = vcmpps_avx(auVar69,auVar86,2);
          auVar72 = vandps_avx(auVar79,auVar72);
          auVar79 = auVar71 & auVar72;
          if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar79[0xf] < '\0') {
            auVar71 = vandps_avx(auVar72,auVar71);
            auVar72 = vcmpps_avx(auVar47,_DAT_01feba10,4);
            auVar79 = auVar71 & auVar72;
            if ((((auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar79 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar79[0xf] < '\0') {
              auVar41 = vandps_avx(auVar72,auVar71);
              local_1958._0_8_ = auVar80._0_8_;
              local_17f8 = local_1958._0_8_;
              local_1958._8_8_ = auVar80._8_8_;
              uStack_17f0 = local_1958._8_8_;
              local_1818 = auVar61;
              local_1808 = auVar66;
              local_17e8 = auVar78;
              _local_17d8 = auVar69;
              _local_17c8 = auVar74;
              _local_17b8 = auVar94;
            }
          }
        }
        auVar50 = vpcmpeqd_avx(auVar50,auVar50);
      }
      auVar97 = ZEXT1664(auVar50);
      auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      pGVar4 = (context->scene->geometries).items[uVar23].ptr;
      uVar96 = pGVar4->mask;
      auVar48._4_4_ = uVar96;
      auVar48._0_4_ = uVar96;
      auVar48._8_4_ = uVar96;
      auVar48._12_4_ = uVar96;
      auVar71 = vandps_avx(auVar48,*(undefined1 (*) [16])(ray + 0x90));
      auVar71 = vpcmpeqd_avx(auVar71,_DAT_01feba10);
      auVar66 = auVar41 & ~auVar71;
      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar66[0xf] < '\0'
         ) {
        auVar41 = vandnps_avx(auVar71,auVar41);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar71 = vrcpps_avx(local_17e8);
          fVar45 = auVar71._0_4_;
          auVar57._0_4_ = local_17e8._0_4_ * fVar45;
          fVar52 = auVar71._4_4_;
          auVar57._4_4_ = local_17e8._4_4_ * fVar52;
          fVar53 = auVar71._8_4_;
          auVar57._8_4_ = local_17e8._8_4_ * fVar53;
          fVar54 = auVar71._12_4_;
          auVar57._12_4_ = local_17e8._12_4_ * fVar54;
          auVar65._8_4_ = 0x3f800000;
          auVar65._0_8_ = &DAT_3f8000003f800000;
          auVar65._12_4_ = 0x3f800000;
          auVar71 = vsubps_avx(auVar65,auVar57);
          fVar45 = fVar45 + fVar45 * auVar71._0_4_;
          fVar52 = fVar52 + fVar52 * auVar71._4_4_;
          fVar53 = fVar53 + fVar53 * auVar71._8_4_;
          fVar54 = fVar54 + fVar54 * auVar71._12_4_;
          local_1738._0_4_ = fVar45 * (float)local_17b8._0_4_;
          local_1738._4_4_ = fVar52 * (float)local_17b8._4_4_;
          local_1738._8_4_ = fVar53 * fStack_17b0;
          local_1738._12_4_ = fVar54 * fStack_17ac;
          local_1728 = fVar45 * (float)local_17c8._0_4_;
          fStack_1724 = fVar52 * (float)local_17c8._4_4_;
          fStack_1720 = fVar53 * fStack_17c0;
          fStack_171c = fVar54 * fStack_17bc;
          local_1708 = vpshufd_avx(ZEXT416(uVar23),0);
          local_1718 = vpshufd_avx(ZEXT416(*(uint *)(lVar28 + uVar27 * 4)),0);
          local_1768 = local_17f8;
          uStack_1760 = uStack_17f0;
          local_1758 = local_1808._0_8_;
          uStack_1750 = local_1808._8_8_;
          local_1748 = local_1818;
          auVar49._0_4_ = fVar45 * (float)local_17d8._0_4_;
          auVar49._4_4_ = fVar52 * (float)local_17d8._4_4_;
          auVar49._8_4_ = fVar53 * fStack_17d0;
          auVar49._12_4_ = fVar54 * fStack_17cc;
          vcmpps_avx(ZEXT1632(local_1738),ZEXT1632(local_1738),0xf);
          uStack_16f4 = context->user->instID[0];
          local_16f8 = uStack_16f4;
          uStack_16f0 = uStack_16f4;
          uStack_16ec = uStack_16f4;
          auStack_16e8._4_4_ = context->user->instPrimID[0];
          auStack_16e8._0_4_ = auStack_16e8._4_4_;
          auStack_16e8._8_4_ = auStack_16e8._4_4_;
          auStack_16e8._12_4_ = auStack_16e8._4_4_;
          auVar71 = *(undefined1 (*) [16])(ray + 0x80);
          auVar66 = vblendvps_avx(auVar71,auVar49,auVar41);
          *(undefined1 (*) [16])(ray + 0x80) = auVar66;
          args.valid = (int *)local_1968;
          args.geometryUserPtr = pGVar4->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_1768;
          args.N = 4;
          local_1968 = auVar41;
          args.ray = (RTCRayN *)ray;
          if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar4->occlusionFilterN)(&args);
            auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          }
          if (local_1968 == (undefined1  [16])0x0) {
            auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
            auVar50 = vpcmpeqd_avx(auVar50,auVar50);
            auVar97 = ZEXT1664(auVar50);
            auVar50 = auVar50 ^ auVar41;
          }
          else {
            p_Var5 = context->args->filter;
            auVar50 = vpcmpeqd_avx(auVar50,auVar50);
            auVar97 = ZEXT1664(auVar50);
            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var5)(&args);
              auVar50 = vpcmpeqd_avx(auVar50,auVar50);
              auVar97 = ZEXT1664(auVar50);
              auVar95 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            }
            auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,local_1968);
            auVar50 = auVar97._0_16_ ^ auVar41;
            auVar58._8_4_ = 0xff800000;
            auVar58._0_8_ = 0xff800000ff800000;
            auVar58._12_4_ = 0xff800000;
            auVar41 = vblendvps_avx(auVar58,*(undefined1 (*) [16])(args.ray + 0x80),auVar41);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar41;
          }
          auVar50 = vpslld_avx(auVar50,0x1f);
          auVar41 = vpsrad_avx(auVar50,0x1f);
          auVar50 = vblendvps_avx(auVar71,*(undefined1 (*) [16])pRVar1,auVar50);
          *(undefined1 (*) [16])pRVar1 = auVar50;
        }
        auVar62 = vpandn_avx(auVar41,auVar62);
      }
      if (((((auVar62 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar62 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar62 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar62[0xf])
         || (bVar33 = 2 < uVar27, uVar27 = uVar27 + 1, bVar33)) break;
    }
    auVar50 = vpand_avx(auVar62,auVar60);
    auVar60 = auVar60 & auVar62;
    if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar97._0_16_ ^ auVar50);
LAB_00318995:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar22.field_0,(undefined1  [16])terminated.field_0);
  auVar60 = auVar97._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar60 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar60[0xf]) {
LAB_003189cb:
    iVar24 = 3;
  }
  else {
    auVar59._8_4_ = 0xff800000;
    auVar59._0_8_ = 0xff800000ff800000;
    auVar59._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar59,
                       (undefined1  [16])terminated.field_0);
    iVar24 = 0;
  }
LAB_003189ce:
  if (iVar24 == 3) {
    auVar6 = vandps_avx(auVar51,(undefined1  [16])terminated.field_0);
    auVar51._8_4_ = 0xff800000;
    auVar51._0_8_ = 0xff800000ff800000;
    auVar51._12_4_ = 0xff800000;
    auVar6 = vmaskmovps_avx(auVar6,auVar51);
    *(undefined1 (*) [16])pRVar1 = auVar6;
    return;
  }
  goto LAB_003180f7;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }